

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint countZeros(uchar *data,size_t size,size_t pos)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  
  puVar1 = data + pos;
  puVar4 = puVar1;
  puVar2 = data + size;
  if (data + pos + 0x102 <= data + size) {
    puVar2 = data + pos + 0x102;
  }
  for (; (puVar3 = puVar2, puVar4 != puVar2 && (puVar3 = puVar4, *puVar4 == '\0'));
      puVar4 = puVar4 + 1) {
  }
  return (int)puVar3 - (int)puVar1;
}

Assistant:

static unsigned countZeros(const unsigned char* data, size_t size, size_t pos)
{
  const unsigned char* start = data + pos;
  const unsigned char* end = start + MAX_SUPPORTED_DEFLATE_LENGTH;
  if(end > data + size) end = data + size;
  data = start;
  while (data != end && *data == 0) data++;
  /*subtracting two addresses returned as 32-bit number (max value is MAX_SUPPORTED_DEFLATE_LENGTH)*/
  return (unsigned)(data - start);
}